

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

void __thiscall tlx::CmdlineParser::ArgumentString::print_value(ArgumentString *this,ostream *os)

{
  ostream *poVar1;
  ostream *os_local;
  ArgumentString *this_local;
  
  poVar1 = std::operator<<(os,'\"');
  poVar1 = std::operator<<(poVar1,(string *)this->dest_);
  std::operator<<(poVar1,'\"');
  return;
}

Assistant:

void print_value(std::ostream& os) const final {
        os << '"' << dest_ << '"';
    }